

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,undefined8 *xn,xpath_allocator *alloc,
          byte once)

{
  xml_attribute_struct *a;
  bool bVar1;
  xml_node_struct *n;
  
  n = (xml_node_struct *)*xn;
  a = (xml_attribute_struct *)xn[1];
  if (n == (xml_node_struct *)0x0 || a != (xml_attribute_struct *)0x0) {
    if (n != (xml_node_struct *)0x0 && a != (xml_attribute_struct *)0x0) {
      if ((this->_test == '\x02') && (bVar1 = step_push(this,ns,a,n,alloc), (bVar1 & once) != 0)) {
        return;
      }
      for (; n != (xml_node_struct *)0x0; n = n->parent) {
        bVar1 = step_push(this,ns,n,alloc);
        if ((bVar1 & once) != 0) {
          return;
        }
      }
    }
  }
  else {
    do {
      bVar1 = step_push(this,ns,n,alloc);
      if ((bVar1 & once) != 0) {
        return;
      }
      n = n->parent;
    } while (n != (xml_node_struct *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}